

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

int __thiscall
CVmObjHTTPRequest::getp_endChunkedReply
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  vm_httpreq_ext *pvVar2;
  ssize_t sVar3;
  int *in_RCX;
  vm_val_t *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar4;
  CVmObjHTTPRequest *in_RDI;
  int in_R8D;
  vm_val_t *headers;
  TadsServerThread *t;
  TadsHttpRequest *req;
  uint argc;
  undefined4 in_stack_ffffffffffffff98;
  int sock_err;
  vm_val_t *in_stack_ffffffffffffffa8;
  TadsHttpServerThread *this_00;
  vm_val_t *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int n;
  
  if (in_RCX == (int *)0x0) {
    sock_err = 0;
  }
  else {
    sock_err = *in_RCX;
  }
  n = sock_err;
  if ((getp_endChunkedReply(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_endChunkedReply(unsigned_int,vm_val_t*,unsigned_int*)::desc)
     , iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_endChunkedReply::desc,0,1);
    __cxa_guard_release(&getp_endChunkedReply(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffffa8,(uint *)in_RDI,
                     (CVmNativeCodeDesc *)CONCAT44(sock_err,in_stack_ffffffffffffff98));
  if (iVar1 == 0) {
    pvVar2 = get_ext(in_RDI);
    this_00 = pvVar2->req->thread;
    pvVar4 = extraout_RDX;
    if ((pvVar2->req->super_TadsEventMessage).super_TadsMessage.completed != 0) {
      throw_net_err((char *)in_RDI,sock_err);
      pvVar4 = extraout_RDX_00;
    }
    sVar3 = TadsServerThread::send
                      (&this_00->super_TadsServerThread,0x3a946f,pvVar4,(size_t)in_RCX,in_R8D);
    pvVar4 = extraout_RDX_01;
    if ((int)sVar3 == 0) {
      TadsServerThread::last_error((TadsServerThread *)0x2565b1);
      throw_net_err((char *)in_RDI,sock_err);
      pvVar4 = extraout_RDX_02;
    }
    if (n != 0) {
      CVmStack::get(0);
      iVar1 = vm_val_t::is_listlike((vm_val_t *)this_00);
      if (iVar1 == 0) {
        err_throw(0);
      }
      send_custom_headers((TadsServerThread *)CONCAT44(n,in_stack_ffffffffffffffd0),
                          in_stack_ffffffffffffffc8);
      pvVar4 = extraout_RDX_03;
    }
    sVar3 = TadsServerThread::send
                      (&this_00->super_TadsServerThread,0x3a9435,pvVar4,(size_t)in_RCX,in_R8D);
    if ((int)sVar3 == 0) {
      TadsServerThread::last_error((TadsServerThread *)0x256625);
      throw_net_err((char *)in_RDI,sock_err);
    }
    TadsHttpRequest::complete((TadsHttpRequest *)this_00);
    CVmStack::discard(n);
    vm_val_t::set_nil(in_RDX);
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_endChunkedReply(VMG_ vm_obj_id_t self,
                                            vm_val_t *retval, uint *oargc)
{
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the request and the thread */
    TadsHttpRequest *req = get_ext()->req;
    TadsServerThread *t = req->thread;

    /* if the request is already completed, this is an error */
    if (req->completed)
        throw_net_err(vmg_ "request already completed", 0);

    /* send the "0" length prefix to indicate we're done */
    if (!t->send("0\r\n"))
        throw_net_err(vmg_ "error sending end-of-stream", t->last_error());

    /* get the headers argument */
    const vm_val_t *headers = 0;
    if (argc >= 1)
    {
        /* get the headers value */
        headers = G_stk->get(0);

        /* make sure it's a list */
        if (!headers->is_listlike(vmg0_))
            err_throw(VMERR_LIST_VAL_REQD);

        /* send the headers */
        send_custom_headers(vmg_ t, headers);
    }

    /* send the closing CR-LF */
    if (!t->send("\r\n"))
        throw_net_err(vmg_ "error sending suffix", t->last_error());

    /* mark the request as completed */
    req->complete();

    /* discard arguments */
    G_stk->discard(argc);

    /* no result */
    retval->set_nil();

    /* handled */
    return TRUE;
}